

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O0

int AF_A_KillChildren(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *origin;
  DObject *this;
  AActor *killtarget;
  undefined8 inflictor_00;
  PClassActor *filter_00;
  int flags_00;
  AActor *source_00;
  bool bVar1;
  bool local_ab;
  bool local_a6;
  bool local_a3;
  FName local_a0;
  FName local_9c;
  AActor *local_98;
  AActor *mo;
  TThinkerIterator<AActor> it;
  AActor *inflictor;
  AActor *source;
  int local_60;
  int inflict;
  int src;
  FName species;
  MetaClass *filter;
  int flags;
  FName damagetype;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x1967,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x1967,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  origin = (AActor *)(param->field_0).field_1.a;
  local_a3 = true;
  if (origin != (AActor *)0x0) {
    local_a3 = DObject::IsKindOf((DObject *)origin,AActor::RegistrationInfo.MyClass);
  }
  if (local_a3 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x1967,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar1 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
      bVar1 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar1) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x1967,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    this = (DObject *)param[1].field_0.field_1.a;
    local_a6 = true;
    if (this != (DObject *)0x0) {
      local_a6 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    }
    if (local_a6 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x1967,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
  }
  if ((numparam < 3) || (param[2].field_0.field_3.Type == 0xff)) {
    _flags = (void *)0x0;
  }
  else {
    bVar1 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar1 = true, param[2].field_0.field_1.atag != 8)) {
      bVar1 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar1) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x1967,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    _flags = param[2].field_0.field_1.a;
  }
  FName::FName((FName *)((long)&filter + 4));
  if ((numparam < 4) || (param[3].field_0.field_3.Type == 0xff)) {
    FName::operator=((FName *)((long)&filter + 4),NAME_None);
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x1968,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    FName::operator=((FName *)((long)&filter + 4),param[3].field_0.i);
  }
  if ((numparam < 5) || (param[4].field_0.field_3.Type == 0xff)) {
    filter._0_4_ = 0;
  }
  else {
    if (param[4].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x1969,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    filter._0_4_ = param[4].field_0.i;
  }
  if ((numparam < 6) || (param[5].field_0.field_3.Type == 0xff)) {
    _src = (PClassActor *)0x0;
  }
  else {
    bVar1 = false;
    if ((param[5].field_0.field_3.Type == '\x03') &&
       (bVar1 = true, param[5].field_0.field_1.atag != 1)) {
      bVar1 = param[5].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar1) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x196a,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    _src = (PClassActor *)param[5].field_0.field_1.a;
    local_ab = true;
    if (_src != (PClassActor *)0x0) {
      local_ab = PClass::IsDescendantOf((PClass *)_src,AActor::RegistrationInfo.MyClass);
    }
    if (local_ab == false) {
      __assert_fail("filter == NULL || filter->IsDescendantOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x196a,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
  }
  FName::FName((FName *)&inflict);
  if ((numparam < 7) || (param[6].field_0.field_3.Type == 0xff)) {
    FName::operator=((FName *)&inflict,NAME_None);
  }
  else {
    if (param[6].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x196b,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    FName::operator=((FName *)&inflict,param[6].field_0.i);
  }
  if ((numparam < 8) || (param[7].field_0.field_3.Type == 0xff)) {
    local_60 = 0;
  }
  else {
    if (param[7].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x196c,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    local_60 = param[7].field_0.i;
  }
  if ((numparam < 9) || (param[8].field_0.field_3.Type == 0xff)) {
    source._4_4_ = 0;
  }
  else {
    if (param[8].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x196d,"int AF_A_KillChildren(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    source._4_4_ = param[8].field_0.i;
  }
  source_00 = COPY_AAPTR(origin,local_60);
  it.super_FThinkerIterator._16_8_ = COPY_AAPTR(origin,source._4_4_);
  TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&mo,0x80);
  while (local_98 = TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&mo),
        local_98 != (AActor *)0x0) {
    bVar1 = TObjPtr<AActor>::operator==(&local_98->master,origin);
    inflictor_00 = it.super_FThinkerIterator._16_8_;
    killtarget = local_98;
    if (bVar1) {
      FName::FName(&local_9c,(FName *)((long)&filter + 4));
      flags_00 = (int)filter;
      filter_00 = _src;
      FName::FName(&local_a0,(FName *)&inflict);
      DoKill(killtarget,(AActor *)inflictor_00,source_00,&local_9c,flags_00,filter_00,&local_a0);
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_KillChildren)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_NAME_OPT	(damagetype)	{ damagetype = NAME_None; }
	PARAM_INT_OPT	(flags)			{ flags = 0; }
	PARAM_CLASS_OPT	(filter, AActor){ filter = NULL; }
	PARAM_NAME_OPT	(species)		{ species = NAME_None; }
	PARAM_INT_OPT	(src)			{ src = AAPTR_DEFAULT; }
	PARAM_INT_OPT	(inflict)		{ inflict = AAPTR_DEFAULT; }

	AActor *source = COPY_AAPTR(self, src);
	AActor *inflictor = COPY_AAPTR(self, inflict);

	TThinkerIterator<AActor> it;
	AActor *mo;

	while ( (mo = it.Next()) )
	{
		if (mo->master == self) 
		{
			DoKill(mo, inflictor, source, damagetype, flags, filter, species);
		}
	}
	return 0;
}